

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

size_t __thiscall clickhouse::BufferedOutput::DoNext(BufferedOutput *this,void **data,size_t len)

{
  size_t sVar1;
  ulong in_RDX;
  ZeroCopyOutput *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  sVar1 = ArrayOutput::Avail((ArrayOutput *)(in_RDI + 5));
  if (sVar1 < in_RDX) {
    OutputStream::Flush((OutputStream *)0x1e7377);
  }
  sVar1 = ZeroCopyOutput::Next(in_RDI,in_stack_ffffffffffffffd8,0x1e738f);
  return sVar1;
}

Assistant:

size_t BufferedOutput::DoNext(void** data, size_t len) {
    if (array_output_.Avail() < len) {
        Flush();
    }

    return array_output_.Next(data, len);

}